

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *vQueue,Nwk_Obj_t *pObj,int iCurrent,int fArrival)

{
  Nwk_Obj_t *pNVar1;
  Nwk_Obj_t *pObj_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_34;
  int i;
  Nwk_Obj_t *pTemp2;
  Nwk_Obj_t *pTemp1;
  int fArrival_local;
  int iCurrent_local;
  Nwk_Obj_t *pObj_local;
  Vec_Ptr_t *vQueue_local;
  
  Vec_PtrPush(vQueue,pObj);
  iVar2 = Vec_PtrSize(vQueue);
  while (local_34 = iVar2 + -1, iCurrent + 1 < local_34) {
    pNVar1 = (Nwk_Obj_t *)vQueue->pArray[local_34];
    pObj_00 = (Nwk_Obj_t *)vQueue->pArray[iVar2 + -2];
    if (fArrival == 0) {
      iVar3 = Nwk_ObjLevel(pObj_00);
      iVar4 = Nwk_ObjLevel(pNVar1);
      if (iVar4 <= iVar3) break;
    }
    else {
      iVar3 = Nwk_ObjLevel(pObj_00);
      iVar4 = Nwk_ObjLevel(pNVar1);
      if (iVar3 <= iVar4) break;
    }
    vQueue->pArray[iVar2 + -2] = pNVar1;
    vQueue->pArray[local_34] = pObj_00;
    iVar2 = local_34;
  }
  local_34 = iCurrent + 1;
  do {
    iVar2 = Vec_PtrSize(vQueue);
    if (iVar2 + -1 <= local_34) {
      return;
    }
    pNVar1 = (Nwk_Obj_t *)vQueue->pArray[local_34 + 1];
    if (fArrival == 0) {
      iVar2 = Nwk_ObjLevel((Nwk_Obj_t *)vQueue->pArray[local_34]);
      iVar3 = Nwk_ObjLevel(pNVar1);
      if (iVar2 < iVar3) {
        __assert_fail("Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                      ,0x223,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
      }
    }
    else {
      iVar2 = Nwk_ObjLevel((Nwk_Obj_t *)vQueue->pArray[local_34]);
      iVar3 = Nwk_ObjLevel(pNVar1);
      if (iVar3 < iVar2) {
        __assert_fail("Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                      ,0x221,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Nwk_NodeUpdateAddToQueue( Vec_Ptr_t * vQueue, Nwk_Obj_t * pObj, int iCurrent, int fArrival )
{
    Nwk_Obj_t * pTemp1, * pTemp2;
    int i;
    Vec_PtrPush( vQueue, pObj );
    for ( i = Vec_PtrSize(vQueue) - 1; i > iCurrent + 1; i-- )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i-1];
        if ( fArrival )
        {
            if ( Nwk_ObjLevel(pTemp2) <= Nwk_ObjLevel(pTemp1) )
                break;
        }
        else
        {
            if ( Nwk_ObjLevel(pTemp2) >= Nwk_ObjLevel(pTemp1) )
                break;
        }
        vQueue->pArray[i-1] = pTemp1;
        vQueue->pArray[i]   = pTemp2;
    }
    // verification
    for ( i = iCurrent + 1; i < Vec_PtrSize(vQueue) - 1; i++ )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i+1];
        if ( fArrival )
            assert( Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2) );
        else
            assert( Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2) );
    }
}